

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall czh::node::Node::Node(Node *this)

{
  allocator<char> local_11;
  Node *local_10;
  Node *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->last_node = (Node *)0x0;
  std::variant<czh::node::Node::NodeData,_czh::value::Value>::variant(&this->data);
  czh::token::Token::Token(&this->czh_token);
  std::variant<czh::node::Node::NodeData,_czh::value::Value>::emplace<czh::node::Node::NodeData>
            (&this->data);
  return;
}

Assistant:

Node() : name(""), last_node(nullptr) { data.emplace<NodeData>(); }